

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

void __thiscall
helics::ValueFederateManager::getUpdateFromCore
          (ValueFederateManager *this,InterfaceHandle updatedHandle)

{
  long *plVar1;
  void *pvVar2;
  undefined1 uVar3;
  Input *this_00;
  undefined4 in_ESI;
  data_view *in_RDI;
  InputData *info;
  BlockIterator<helics::Input,_32,_helics::Input_**> fid;
  handle inpHandle;
  shared_ptr<const_helics::SmallBuffer> data;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *in_stack_ffffffffffffff28;
  data_view *dv;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  data_view local_b8;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *in_stack_ffffffffffffff68;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff70;
  BlockIterator<helics::Input,_32,_helics::Input_**> local_68;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  local_40 [2];
  
  plVar1 = (long *)in_RDI[0x10].dblock._M_len;
  (**(code **)(*plVar1 + 400))(plVar1,in_ESI,0);
  std::shared_ptr<const_helics::SmallBuffer>::shared_ptr
            ((shared_ptr<const_helics::SmallBuffer> *)in_stack_ffffffffffffff30,
             (shared_ptr<const_helics::SmallBuffer> *)in_stack_ffffffffffffff28);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(in_stack_ffffffffffffff68);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::operator->(local_40);
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (in_stack_ffffffffffffff70,(InterfaceHandle *)in_stack_ffffffffffffff68);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::operator->(local_40);
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::end
            (in_stack_ffffffffffffff30);
  uVar3 = gmlc::containers::BlockIterator<helics::Input,32,helics::Input**>::operator!=
                    ((BlockIterator<helics::Input,_32,_helics::Input_**> *)in_stack_ffffffffffffff30
                     ,in_stack_ffffffffffffff28);
  if ((bool)uVar3) {
    this_00 = gmlc::containers::BlockIterator<helics::Input,_32,_helics::Input_**>::operator->
                        (&local_68);
    pvVar2 = this_00->dataReference;
    dv = &local_b8;
    std::shared_ptr<const_helics::SmallBuffer>::shared_ptr
              ((shared_ptr<const_helics::SmallBuffer> *)this_00,
               (shared_ptr<const_helics::SmallBuffer> *)dv);
    data_view::data_view
              (in_RDI,(shared_ptr<const_helics::SmallBuffer> *)
                      CONCAT17(uVar3,in_stack_ffffffffffffff38));
    data_view::operator=((data_view *)this_00,dv);
    data_view::~data_view((data_view *)0x2ddb1b);
    std::shared_ptr<const_helics::SmallBuffer>::~shared_ptr
              ((shared_ptr<const_helics::SmallBuffer> *)0x2ddb25);
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar2 + 0x28) =
         in_RDI[0xf].ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                  *)0x2ddb95);
  std::shared_ptr<const_helics::SmallBuffer>::~shared_ptr
            ((shared_ptr<const_helics::SmallBuffer> *)0x2ddba2);
  return;
}

Assistant:

void ValueFederateManager::getUpdateFromCore(InterfaceHandle updatedHandle)
{
    auto data = coreObject->getValue(updatedHandle);
    auto inpHandle = inputs.lock();
    /** find the id*/
    auto fid = inpHandle->find(updatedHandle);
    if (fid != inpHandle->end()) {  // assign the data

        auto* info = static_cast<InputData*>(fid->dataReference);
        info->lastData = data_view(std::move(data));
        info->lastUpdate = CurrentTime;
    }
}